

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scripthash.cpp
# Opt level: O2

void __thiscall
ScriptHash_ScriptHash_hex_exception_Test::TestBody(ScriptHash_ScriptHash_hex_exception_Test *this)

{
  char *in_R9;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  string hex;
  ScriptHash script_hash;
  
  std::__cxx11::string::string((string *)&hex,"xxxx",(allocator *)&script_hash);
  cfd::core::ScriptHash::ScriptHash(&script_hash,&hex);
  cfd::core::ScriptHash::~ScriptHash(&script_hash);
  std::__cxx11::string::~string((string *)&hex);
  script_hash._vptr_ScriptHash._0_1_ = 0;
  script_hash.script_hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  testing::Message::Message((Message *)&local_60);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&hex,(internal *)&script_hash,(AssertionResult *)0x414889,"false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scripthash.cpp"
             ,0x25,hex._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  std::__cxx11::string::~string((string *)&hex);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_60);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script_hash.script_hash_);
  return;
}

Assistant:

TEST(ScriptHash, ScriptHash_hex_exception) {
  try {
    std::string hex("xxxx");
    ScriptHash script_hash(hex);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "hex to byte convert error.");
    return;
  }
  ASSERT_TRUE(false);
}